

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InlineReader.cpp
# Opt level: O2

void __thiscall adios2::core::engine::InlineReader::DoClose(InlineReader *this,int transportIndex)

{
  int iVar1;
  ostream *poVar2;
  undefined4 in_register_00000034;
  ScopedTimer __var2233;
  ScopedTimer local_10;
  
  if (DoClose(int)::__var233 == '\0') {
    iVar1 = __cxa_guard_acquire(&DoClose(int)::__var233,
                                CONCAT44(in_register_00000034,transportIndex));
    if (iVar1 != 0) {
      DoClose::__var233 = (void *)ps_timer_create_("InlineReader::DoClose");
      __cxa_guard_release(&DoClose(int)::__var233);
    }
  }
  external::perfstubs_profiler::ScopedTimer::ScopedTimer(&local_10,DoClose::__var233);
  if (this->m_Verbosity == 5) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Inline Reader ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->m_ReaderRank);
    poVar2 = std::operator<<(poVar2," Close(");
    poVar2 = std::operator<<(poVar2,(string *)&(this->super_Engine).m_Name);
    std::operator<<(poVar2,")\n");
  }
  external::perfstubs_profiler::ScopedTimer::~ScopedTimer(&local_10);
  return;
}

Assistant:

void InlineReader::DoClose(const int transportIndex)
{
    PERFSTUBS_SCOPED_TIMER("InlineReader::DoClose");
    if (m_Verbosity == 5)
    {
        std::cout << "Inline Reader " << m_ReaderRank << " Close(" << m_Name << ")\n";
    }
}